

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

bool __thiscall libcellml::Generator::GeneratorImpl::modelHasOdes(GeneratorImpl *this)

{
  Type TVar1;
  
  TVar1 = AnalyserModel::type((this->mModel).
                              super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  return TVar1 == DAE || TVar1 == ODE;
}

Assistant:

bool Generator::GeneratorImpl::modelHasOdes() const
{
    switch (mModel->type()) {
    case AnalyserModel::Type::ODE:
    case AnalyserModel::Type::DAE:
        return true;
    default:
        return false;
    }
}